

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O0

string * rcg::storeImage(string *name,ImgFmt fmt,Image *image,size_t yoffset,size_t height)

{
  int in_EDX;
  string *in_RDI;
  string *ret;
  size_t in_stack_00000380;
  size_t in_stack_00000388;
  Image *in_stack_00000390;
  string *in_stack_00000398;
  size_t in_stack_00000ac0;
  size_t in_stack_00000ac8;
  Image *in_stack_00000ad0;
  string *in_stack_00000ad8;
  string local_88 [48];
  string local_58 [39];
  undefined1 local_31;
  int local_14;
  
  local_31 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  if ((local_14 == 0) || (local_14 != 1)) {
    anon_unknown_1::storeImagePNM
              (in_stack_00000ad8,in_stack_00000ad0,in_stack_00000ac8,in_stack_00000ac0);
    std::__cxx11::string::operator=(in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
  }
  else {
    anon_unknown_1::storeImagePNG
              (in_stack_00000398,in_stack_00000390,in_stack_00000388,in_stack_00000380);
    std::__cxx11::string::operator=(in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

std::string storeImage(const std::string &name, ImgFmt fmt, const Image &image,
  size_t yoffset, size_t height)
{
  std::string ret;

  switch (fmt)
  {
    case PNG:
#ifdef INCLUDE_PNG
      ret=storeImagePNG(name, image, yoffset, height);
#else
      throw IOException("storeImage(): Support for PNG image file format is not compiled in!");
#endif
      break;

    default:
    case PNM:
      ret=storeImagePNM(name, image, yoffset, height);
      break;
  }

  return ret;
}